

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

ReadWriter_ptr __thiscall XipFile::getrvareader(XipFile *this,uint32_t rva,uint32_t size)

{
  OffsetReader *this_00;
  RangeReader *this_01;
  element_type *peVar1;
  uint in_ECX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long lVar2;
  ReadWriter_ptr RVar3;
  shared_ptr<ReadWriter> local_58;
  undefined1 local_45;
  shared_ptr<ReadWriter> local_38;
  undefined1 local_21;
  uint local_20;
  uint32_t local_1c;
  uint32_t size_local;
  uint32_t rva_local;
  XipFile *this_local;
  ReadWriter_ptr *r;
  
  lVar2 = CONCAT44(in_register_00000034,rva);
  local_21 = 0;
  local_20 = in_ECX;
  local_1c = size;
  _size_local = lVar2;
  this_local = this;
  this_00 = (OffsetReader *)operator_new(0x30);
  local_45 = 1;
  std::shared_ptr<ReadWriter>::shared_ptr(&local_38,(shared_ptr<ReadWriter> *)(lVar2 + 8));
  OffsetReader::OffsetReader
            (this_00,&local_38,(ulong)(local_1c - *(int *)(lVar2 + 0xa0)),(ulong)local_20);
  local_45 = 0;
  std::shared_ptr<ReadWriter>::shared_ptr<OffsetReader,void>((shared_ptr<ReadWriter> *)this,this_00)
  ;
  std::shared_ptr<ReadWriter>::~shared_ptr(&local_38);
  this_01 = (RangeReader *)operator_new(0x40);
  std::shared_ptr<ReadWriter>::shared_ptr(&local_58,(shared_ptr<ReadWriter> *)this);
  RangeReader::RangeReader(this_01,&local_58,0,(ulong)local_20);
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::reset<RangeReader>
            ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)this,this_01);
  std::shared_ptr<ReadWriter>::~shared_ptr(&local_58);
  peVar1 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  (*peVar1->_vptr_ReadWriter[4])(peVar1,0);
  RVar3.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar3.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ReadWriter_ptr)RVar3.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ReadWriter_ptr getrvareader(uint32_t rva, uint32_t size)
    {
        ReadWriter_ptr r(new OffsetReader(_r, rva-_hdr.rvabase, size));
        r.reset(new RangeReader(r, 0, size));
        r->setpos(0);
        return r;
    }